

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddCollateType(Parse *pParse,Token *pToken)

{
  short sVar1;
  Table *pTVar2;
  sqlite3 *db;
  char *zName;
  CollSeq *pCVar3;
  Index *pIVar4;
  long lVar5;
  
  pTVar2 = pParse->pNewTable;
  if (pTVar2 != (Table *)0x0) {
    sVar1 = pTVar2->nCol;
    db = pParse->db;
    zName = sqlite3NameFromToken(db,pToken);
    if (zName != (char *)0x0) {
      pCVar3 = sqlite3LocateCollSeq(pParse,zName);
      if (pCVar3 == (CollSeq *)0x0) {
        sqlite3DbFree(db,zName);
        return;
      }
      lVar5 = (long)sVar1 + -1;
      pTVar2->aCol[lVar5].zColl = zName;
      for (pIVar4 = pTVar2->pIndex; pIVar4 != (Index *)0x0; pIVar4 = pIVar4->pNext) {
        if (*pIVar4->aiColumn == (int)lVar5) {
          *pIVar4->azColl = pTVar2->aCol[lVar5].zColl;
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddCollateType(Parse *pParse, Token *pToken){
  Table *p;
  int i;
  char *zColl;              /* Dequoted name of collation sequence */
  sqlite3 *db;

  if( (p = pParse->pNewTable)==0 ) return;
  i = p->nCol-1;
  db = pParse->db;
  zColl = sqlite3NameFromToken(db, pToken);
  if( !zColl ) return;

  if( sqlite3LocateCollSeq(pParse, zColl) ){
    Index *pIdx;
    p->aCol[i].zColl = zColl;
  
    /* If the column is declared as "<name> PRIMARY KEY COLLATE <type>",
    ** then an index may have been created on this column before the
    ** collation type was added. Correct this if it is the case.
    */
    for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->nColumn==1 );
      if( pIdx->aiColumn[0]==i ){
        pIdx->azColl[0] = p->aCol[i].zColl;
      }
    }
  }else{
    sqlite3DbFree(db, zColl);
  }
}